

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O2

void __thiscall trng::mrg2::step(mrg2 *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  
  iVar1 = (this->P).a[0];
  iVar2 = (this->S).r[0];
  iVar3 = (this->P).a[1];
  iVar4 = (this->S).r[1];
  (this->S).r[1] = iVar2;
  iVar5 = int_math::modulo_helper<2147483647,_1>::modulo
                    ((long)iVar4 * (long)iVar3 + (long)iVar1 * (long)iVar2);
  (this->S).r[0] = iVar5;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1])};
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 2>(t);
  }